

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

void __thiscall OpenMD::Stats::~Stats(Stats *this)

{
  pointer pSVar1;
  pointer ppBVar2;
  iterator __begin0;
  pointer ppBVar3;
  StatsData *data;
  pointer pSVar4;
  
  this->_vptr_Stats = (_func_int **)&PTR__Stats_00301f18;
  pSVar1 = (this->data_).
           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar4 = (this->data_).
                super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    ppBVar3 = (pSVar4->accumulatorArray2d).
              super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppBVar2 = (pSVar4->accumulatorArray2d).
              super__Vector_base<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppBVar3 == ppBVar2) {
      if (pSVar4->accumulator != (BaseAccumulator *)0x0) {
        (*pSVar4->accumulator->_vptr_BaseAccumulator[3])();
      }
    }
    else {
      do {
        if (*ppBVar3 != (BaseAccumulator *)0x0) {
          (*(*ppBVar3)->_vptr_BaseAccumulator[3])();
        }
        ppBVar3 = ppBVar3 + 1;
      } while (ppBVar3 != ppBVar2);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
  ::~_Rb_tree(&(this->statsMap_)._M_t);
  std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::~vector
            (&this->data_);
  return;
}

Assistant:

Stats::~Stats() {
    for (auto& data : data_) {
      if (!data.accumulatorArray2d.empty())
        Utils::deletePointers(data.accumulatorArray2d);
      else
        delete data.accumulator;
    }
  }